

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurlURLInputStream.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::CurlURLInputStream::CurlURLInputStream
          (CurlURLInputStream *this,XMLURL *urlSource,XMLNetHTTPInfo *httpInfo)

{
  long lVar1;
  long lVar2;
  int iVar3;
  MemoryManager *pMVar4;
  CURLM *pCVar5;
  CURL *pCVar6;
  XMLCh *pXVar7;
  XMLByte *pXVar8;
  XMLCh *chars;
  undefined4 extraout_var;
  char *pcVar9;
  curl_slist *pcVar10;
  XMLSize_t length_00;
  TranscodeFromStr local_128;
  XMLByte *local_108;
  char *contentType8;
  MalformedURLException *anon_var_0;
  NetAccessorException *anon_var_0_1;
  undefined1 local_e8 [4];
  int runningHandles;
  ArrayJanitor<char> header;
  XMLSize_t length;
  char *headerStart;
  char *headersBufEnd;
  char *headersBuf;
  TranscodeToStr userPass;
  XMLBuffer userPassBuf;
  XMLCh *password;
  XMLCh *username;
  TranscodeToStr url;
  XMLNetHTTPInfo *httpInfo_local;
  XMLURL *urlSource_local;
  CurlURLInputStream *this_local;
  
  BinInputStream::BinInputStream(&this->super_BinInputStream);
  (this->super_BinInputStream)._vptr_BinInputStream =
       (_func_int **)&PTR__CurlURLInputStream_00537428;
  this->fMulti = (CURLM *)0x0;
  this->fEasy = (CURL *)0x0;
  this->fHeadersList = (curl_slist *)0x0;
  pMVar4 = XMLURL::getMemoryManager(urlSource);
  this->fMemoryManager = pMVar4;
  XMLURL::XMLURL(&this->fURLSource,urlSource);
  this->fTotalBytesRead = 0;
  this->fWritePtr = (XMLByte *)0x0;
  this->fBytesRead = 0;
  this->fBytesToRead = 0;
  this->fDataAvailable = false;
  this->fBufferHeadPtr = this->fBuffer;
  this->fBufferTailPtr = this->fBuffer;
  this->fPayload = (char *)0x0;
  this->fPayloadLen = 0;
  this->fContentType = (XMLCh *)0x0;
  pCVar5 = (CURLM *)curl_multi_init();
  this->fMulti = pCVar5;
  pCVar6 = (CURL *)curl_easy_init();
  this->fEasy = pCVar6;
  pXVar7 = XMLURL::getURLText(&this->fURLSource);
  TranscodeToStr::TranscodeToStr
            ((TranscodeToStr *)&username,pXVar7,"ISO8859-1",this->fMemoryManager);
  pCVar6 = this->fEasy;
  pXVar8 = TranscodeToStr::str((TranscodeToStr *)&username);
  curl_easy_setopt(pCVar6,0x2712,pXVar8);
  curl_easy_setopt(this->fEasy,0x2711);
  curl_easy_setopt(this->fEasy,0x4e2b,staticWriteCallback);
  curl_easy_setopt(this->fEasy,0x34,1);
  curl_easy_setopt(this->fEasy,0x44,6);
  pXVar7 = XMLURL::getUser(urlSource);
  chars = XMLURL::getPassword(urlSource);
  if ((pXVar7 != (XMLCh *)0x0) && (chars != (XMLCh *)0x0)) {
    XMLBuffer::XMLBuffer((XMLBuffer *)&userPass.fMemoryManager,0x100,this->fMemoryManager);
    XMLBuffer::append((XMLBuffer *)&userPass.fMemoryManager,pXVar7);
    XMLBuffer::append((XMLBuffer *)&userPass.fMemoryManager,L':');
    XMLBuffer::append((XMLBuffer *)&userPass.fMemoryManager,chars);
    pXVar7 = XMLBuffer::getRawBuffer((XMLBuffer *)&userPass.fMemoryManager);
    TranscodeToStr::TranscodeToStr
              ((TranscodeToStr *)&headersBuf,pXVar7,"ISO8859-1",this->fMemoryManager);
    curl_easy_setopt(this->fEasy,0x6b,0xffffffffffffffef);
    pCVar6 = this->fEasy;
    pXVar8 = TranscodeToStr::str((TranscodeToStr *)&headersBuf);
    curl_easy_setopt(pCVar6,0x2715,pXVar8);
    TranscodeToStr::~TranscodeToStr((TranscodeToStr *)&headersBuf);
    XMLBuffer::~XMLBuffer((XMLBuffer *)&userPass.fMemoryManager);
  }
  if (httpInfo != (XMLNetHTTPInfo *)0x0) {
    iVar3 = *(int *)httpInfo;
    if (iVar3 != 0) {
      if (iVar3 == 1) {
        curl_easy_setopt(this->fEasy,0x2e,1);
      }
      else if (iVar3 == 2) {
        curl_easy_setopt(this->fEasy,0x2f,1);
      }
    }
    if (*(long *)(httpInfo + 8) != 0) {
      length = *(XMLSize_t *)(httpInfo + 8);
      lVar1 = *(long *)(httpInfo + 8);
      lVar2 = *(long *)(httpInfo + 0x10);
      headersBufEnd = (char *)length;
      while (headersBufEnd < (char *)(lVar1 + lVar2)) {
        if (((*headersBufEnd == '\r') && (headersBufEnd + 1 < (char *)(lVar1 + lVar2))) &&
           (headersBufEnd[1] == '\n')) {
          header.fMemoryManager = (MemoryManager *)(headersBufEnd + -length);
          iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                            (this->fMemoryManager,
                             (undefined1 *)((long)&(header.fMemoryManager)->_vptr_MemoryManager + 1)
                            );
          ArrayJanitor<char>::ArrayJanitor
                    ((ArrayJanitor<char> *)local_e8,(char *)CONCAT44(extraout_var,iVar3),
                     this->fMemoryManager);
          pcVar9 = ArrayJanitor<char>::get((ArrayJanitor<char> *)local_e8);
          memcpy(pcVar9,(void *)length,(size_t)header.fMemoryManager);
          pcVar9 = ArrayJanitor<char>::get((ArrayJanitor<char> *)local_e8);
          pcVar9[(long)header.fMemoryManager] = '\0';
          pcVar10 = this->fHeadersList;
          pcVar9 = ArrayJanitor<char>::get((ArrayJanitor<char> *)local_e8);
          pcVar10 = (curl_slist *)curl_slist_append(pcVar10,pcVar9);
          this->fHeadersList = pcVar10;
          length = (XMLSize_t)(headersBufEnd + 2);
          ArrayJanitor<char>::~ArrayJanitor((ArrayJanitor<char> *)local_e8);
          headersBufEnd = (char *)length;
        }
        else {
          headersBufEnd = headersBufEnd + 1;
        }
      }
      curl_easy_setopt(this->fEasy,0x2727,this->fHeadersList);
    }
    if (*(long *)(httpInfo + 0x18) != 0) {
      this->fPayload = *(char **)(httpInfo + 0x18);
      this->fPayloadLen = *(XMLSize_t *)(httpInfo + 0x20);
      curl_easy_setopt(this->fEasy,0x2719);
      curl_easy_setopt(this->fEasy,0x4e2c,staticReadCallback);
      curl_easy_setopt(this->fEasy,0x75a3,this->fPayloadLen);
    }
  }
  curl_multi_add_handle(this->fMulti,this->fEasy);
  do {
    if (this->fBufferHeadPtr != this->fBuffer) break;
    anon_var_0_1._4_4_ = 0;
    readMore(this,(int *)((long)&anon_var_0_1 + 4));
  } while (anon_var_0_1._4_4_ != 0);
  local_108 = (XMLByte *)0x0;
  curl_easy_getinfo(this->fEasy,0x100012,&local_108);
  pXVar8 = local_108;
  if (local_108 != (XMLByte *)0x0) {
    length_00 = XMLString::stringLen((char *)local_108);
    TranscodeFromStr::TranscodeFromStr(&local_128,pXVar8,length_00,"ISO8859-1",this->fMemoryManager)
    ;
    pXVar7 = TranscodeFromStr::adopt(&local_128);
    this->fContentType = pXVar7;
    TranscodeFromStr::~TranscodeFromStr(&local_128);
  }
  TranscodeToStr::~TranscodeToStr((TranscodeToStr *)&username);
  return;
}

Assistant:

CurlURLInputStream::CurlURLInputStream(const XMLURL& urlSource, const XMLNetHTTPInfo* httpInfo/*=0*/)
      : fMulti(0)
      , fEasy(0)
      , fHeadersList(0)
      , fMemoryManager(urlSource.getMemoryManager())
      , fURLSource(urlSource)
      , fTotalBytesRead(0)
      , fWritePtr(0)
      , fBytesRead(0)
      , fBytesToRead(0)
      , fDataAvailable(false)
      , fBufferHeadPtr(fBuffer)
      , fBufferTailPtr(fBuffer)
      , fPayload(0)
      , fPayloadLen(0)
      , fContentType(0)
{
    // Allocate the curl multi handle
    fMulti = curl_multi_init();

    // Allocate the curl easy handle
    fEasy = curl_easy_init();

    // Set URL option
    TranscodeToStr url(fURLSource.getURLText(), "ISO8859-1", fMemoryManager);
    curl_easy_setopt(fEasy, CURLOPT_URL, (char*)url.str());

    // Set up a way to recieve the data
    curl_easy_setopt(fEasy, CURLOPT_WRITEDATA, this);						// Pass this pointer to write function
    curl_easy_setopt(fEasy, CURLOPT_WRITEFUNCTION, staticWriteCallback);	// Our static write function

    // Do redirects
    curl_easy_setopt(fEasy, CURLOPT_FOLLOWLOCATION, (long)1);
    curl_easy_setopt(fEasy, CURLOPT_MAXREDIRS, (long)6);

    // Add username and password if authentication is required
    const XMLCh *username = urlSource.getUser();
    const XMLCh *password = urlSource.getPassword();
    if(username && password) {
        XMLBuffer userPassBuf(256, fMemoryManager);
        userPassBuf.append(username);
        userPassBuf.append(chColon);
        userPassBuf.append(password);

        TranscodeToStr userPass(userPassBuf.getRawBuffer(), "ISO8859-1", fMemoryManager);

        curl_easy_setopt(fEasy, CURLOPT_HTTPAUTH, (long)CURLAUTH_ANY);
        curl_easy_setopt(fEasy, CURLOPT_USERPWD, (char*)userPass.str());
    }

    if(httpInfo) {
        // Set the correct HTTP method
        switch(httpInfo->fHTTPMethod) {
        case XMLNetHTTPInfo::GET:
            break;
        case XMLNetHTTPInfo::PUT:
            curl_easy_setopt(fEasy, CURLOPT_UPLOAD, (long)1);
            break;
        case XMLNetHTTPInfo::POST:
            curl_easy_setopt(fEasy, CURLOPT_POST, (long)1);
            break;
        }

        // Add custom headers
        if(httpInfo->fHeaders) {
            const char *headersBuf = httpInfo->fHeaders;
            const char *headersBufEnd = httpInfo->fHeaders + httpInfo->fHeadersLen;

            const char *headerStart = headersBuf;
            while(headersBuf < headersBufEnd) {
                if(*headersBuf == '\r' && (headersBuf + 1) < headersBufEnd &&
                   *(headersBuf + 1) == '\n') {

                    XMLSize_t length = headersBuf - headerStart;
                    ArrayJanitor<char> header((char*)fMemoryManager->allocate((length + 1) * sizeof(char)),
                                              fMemoryManager);
                    memcpy(header.get(), headerStart, length);
                    header.get()[length] = 0;

                    fHeadersList = curl_slist_append(fHeadersList, header.get());

                    headersBuf += 2;
                    headerStart = headersBuf;
                    continue;
                }
                ++headersBuf;
            }
            curl_easy_setopt(fEasy, CURLOPT_HTTPHEADER, fHeadersList);
        }

        // Set up the payload
        if(httpInfo->fPayload) {
            fPayload = httpInfo->fPayload;
            fPayloadLen = httpInfo->fPayloadLen;
            curl_easy_setopt(fEasy, CURLOPT_READDATA, this);
            curl_easy_setopt(fEasy, CURLOPT_READFUNCTION, staticReadCallback);
            curl_easy_setopt(fEasy, CURLOPT_INFILESIZE_LARGE, (curl_off_t)fPayloadLen);
        }
    }

    // Add easy handle to the multi stack
    curl_multi_add_handle(fMulti, fEasy);

    // Start reading, to get the content type
    while(fBufferHeadPtr == fBuffer)
    {
    	int runningHandles = 0;
        try
        {
            readMore(&runningHandles);
        }
        catch(const MalformedURLException&)
        {
            cleanup();
            throw;
        }
        catch(const NetAccessorException&)
        {
            cleanup();
            throw;
        }
    	if(runningHandles == 0) break;
    }

    // Find the content type
    char *contentType8 = 0;
    curl_easy_getinfo(fEasy, CURLINFO_CONTENT_TYPE, &contentType8);
    if(contentType8)
        fContentType = TranscodeFromStr((XMLByte*)contentType8, XMLString::stringLen(contentType8), "ISO8859-1", fMemoryManager).adopt();
}